

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TemplatedCustomNamer.cpp
# Opt level: O0

string * __thiscall
ApprovalTests::TemplatedCustomNamer::getApprovedFile
          (TemplatedCustomNamer *this,string *extensionWithDot)

{
  Path *in_RDX;
  string *in_RDI;
  Path *in_stack_ffffffffffffff48;
  string local_78 [24];
  string *in_stack_ffffffffffffffa0;
  TemplatedCustomNamer *in_stack_ffffffffffffffa8;
  
  ::std::__cxx11::string::string(local_78,(string *)in_RDX);
  getApprovedFileAsPath(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  Path::toString_abi_cxx11_(in_stack_ffffffffffffff48);
  Path::~Path(in_RDX);
  ::std::__cxx11::string::~string(local_78);
  return in_RDI;
}

Assistant:

std::string TemplatedCustomNamer::getApprovedFile(std::string extensionWithDot) const
    {
        return getApprovedFileAsPath(extensionWithDot).toString();
    }